

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalPartitionedAggregate::Sink
          (PhysicalPartitionedAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  _Alloc_hider __p;
  reference __y;
  GlobalUngroupedAggregateState *args;
  type state;
  ulong __val;
  optional_idx *this_00;
  child_list_t<Value> partition_values;
  string column_name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_108;
  DataChunk *local_e8;
  optional_idx *local_e0;
  PartitionedAggregateGlobalSinkState *local_d8;
  ExecutionContext *local_d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_b0;
  string local_50;
  
  pLVar1 = input->local_state;
  this_00 = &pLVar1[2].partition_info.min_batch_index;
  if (pLVar1[2].partition_info.min_batch_index.index == 0) {
    local_d8 = (PartitionedAggregateGlobalSinkState *)input->global_state;
    local_108.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8 = chunk;
    local_e0 = this_00;
    local_d0 = context;
    for (__val = 0;
        __val < (ulong)((long)(this->groups).
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->groups).
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); __val = __val + 1) {
      ::std::__cxx11::to_string(&local_50,__val);
      __y = vector<duckdb::ColumnPartitionData,_true>::get<true>
                      (&(input->local_state->partition_info).partition_data,__val);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value_&,_true>
                (&local_b0,&local_50,&__y->min_val);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_108,&local_b0);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::~pair(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_108.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_108.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_108.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::STRUCT((Value *)&local_b0,(child_list_t<Value> *)&local_c8);
    Value::operator=((Value *)(pLVar1 + 1),(Value *)&local_b0);
    Value::~Value((Value *)&local_b0);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_c8);
    args = PartitionedAggregateGlobalSinkState::GetOrCreatePartition
                     (local_d8,local_d0->client,(Value *)(pLVar1 + 1));
    make_uniq<duckdb::LocalUngroupedAggregateState,duckdb::GlobalUngroupedAggregateState&>
              ((duckdb *)&local_b0,args);
    __p._M_p = local_b0.first._M_dataplus._M_p;
    this_00 = local_e0;
    local_b0.first._M_dataplus._M_p = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
    ::reset((__uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
             *)local_e0,(pointer)__p._M_p);
    ::std::
    unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
    ::~unique_ptr((unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
                   *)&local_b0);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_108);
    chunk = local_e8;
  }
  state = unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>,_true>
          ::operator*((unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>,_true>
                       *)this_00);
  UngroupedAggregateExecuteState::Sink
            ((UngroupedAggregateExecuteState *)&pLVar1[2].partition_info.partition_data,state,chunk)
  ;
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalPartitionedAggregate::Sink(ExecutionContext &context, DataChunk &chunk,
                                                  OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<PartitionedAggregateGlobalSinkState>();
	auto &lstate = input.local_state.Cast<PartitionedAggregateLocalSinkState>();
	if (!lstate.state) {
		// the local state is not yet initialized for this partition
		// initialize the partition
		child_list_t<Value> partition_values;
		for (idx_t partition_idx = 0; partition_idx < groups.size(); partition_idx++) {
			auto column_name = to_string(partition_idx);
			auto &partition = input.local_state.partition_info.partition_data[partition_idx];
			D_ASSERT(Value::NotDistinctFrom(partition.min_val, partition.max_val));
			partition_values.emplace_back(make_pair(std::move(column_name), partition.min_val));
		}
		lstate.current_partition = Value::STRUCT(std::move(partition_values));

		// initialize the state
		auto &global_aggregate_state = gstate.GetOrCreatePartition(context.client, lstate.current_partition);
		lstate.state = make_uniq<LocalUngroupedAggregateState>(global_aggregate_state);
	}

	// perform the aggregation
	lstate.execute_state.Sink(*lstate.state, chunk);
	return SinkResultType::NEED_MORE_INPUT;
}